

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_7ad8::GetAperiodicResponse
               (int noise_size,int fft_size,double *spectrum,double *aperiodic_ratio,
               double current_vuv,ForwardRealFFT *forward_real_fft,InverseRealFFT *inverse_real_fft,
               MinimumPhaseAnalysis *minimum_phase,double *aperiodic_response,
               RandnState *randn_state)

{
  double dVar1;
  fft_plan p;
  undefined4 in_stack_ffffffffffffff60;
  int iVar2;
  undefined1 local_90 [8];
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  int local_44;
  int local_40;
  int i_2;
  int i_1;
  int i;
  InverseRealFFT *inverse_real_fft_local;
  ForwardRealFFT *forward_real_fft_local;
  double current_vuv_local;
  double *aperiodic_ratio_local;
  double *spectrum_local;
  int fft_size_local;
  int noise_size_local;
  
  _i_1 = inverse_real_fft;
  inverse_real_fft_local = (InverseRealFFT *)forward_real_fft;
  forward_real_fft_local = (ForwardRealFFT *)current_vuv;
  current_vuv_local = (double)aperiodic_ratio;
  aperiodic_ratio_local = spectrum;
  spectrum_local._0_4_ = fft_size;
  spectrum_local._4_4_ = noise_size;
  GetNoiseSpectrum(noise_size,fft_size,forward_real_fft,randn_state);
  if (((double)forward_real_fft_local != 0.0) || (NAN((double)forward_real_fft_local))) {
    for (i_2 = 0; i_2 <= minimum_phase->fft_size / 2; i_2 = i_2 + 1) {
      dVar1 = log(aperiodic_ratio_local[i_2] * *(double *)((long)current_vuv_local + (long)i_2 * 8))
      ;
      minimum_phase->log_spectrum[i_2] = dVar1 / 2.0;
    }
  }
  else {
    for (local_40 = 0; local_40 <= minimum_phase->fft_size / 2; local_40 = local_40 + 1) {
      dVar1 = log(aperiodic_ratio_local[local_40]);
      minimum_phase->log_spectrum[local_40] = dVar1 / 2.0;
    }
  }
  GetMinimumPhaseSpectrum(minimum_phase);
  for (local_44 = 0; local_44 <= (int)spectrum_local / 2; local_44 = local_44 + 1) {
    _i_1->spectrum[local_44][0] =
         minimum_phase->minimum_phase_spectrum[local_44][0] *
         inverse_real_fft_local->spectrum[local_44][0] +
         -(minimum_phase->minimum_phase_spectrum[local_44][1] *
          inverse_real_fft_local->spectrum[local_44][1]);
    _i_1->spectrum[local_44][1] =
         minimum_phase->minimum_phase_spectrum[local_44][0] *
         inverse_real_fft_local->spectrum[local_44][1] +
         minimum_phase->minimum_phase_spectrum[local_44][1] *
         inverse_real_fft_local->spectrum[local_44][0];
  }
  iVar2 = local_44;
  memcpy(local_90,&_i_1->inverse_fft,0x48);
  p._8_8_ = local_80;
  p.n = (undefined4)uStack_88;
  p.sign = uStack_88._4_4_;
  p.c_in = (fft_complex *)uStack_78;
  p.in = (double *)local_70;
  p.c_out = (fft_complex *)uStack_68;
  p.out = (double *)local_60;
  p.input = (double *)uStack_58;
  p.ip = (int *)local_50;
  p.w._0_4_ = in_stack_ffffffffffffff60;
  p.w._4_4_ = iVar2;
  fft_execute(p);
  fftshift(_i_1->waveform,(int)spectrum_local,aperiodic_response);
  return;
}

Assistant:

static void GetAperiodicResponse(int noise_size, int fft_size,
    const double *spectrum, const double *aperiodic_ratio, double current_vuv,
    const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft,
    const MinimumPhaseAnalysis *minimum_phase, double *aperiodic_response,
    RandnState *randn_state) {
  GetNoiseSpectrum(noise_size, fft_size, forward_real_fft, randn_state);

  if (current_vuv != 0.0)
    for (int i = 0; i <= minimum_phase->fft_size / 2; ++i)
      minimum_phase->log_spectrum[i] =
        log(spectrum[i] * aperiodic_ratio[i]) / 2.0;
  else
    for (int i = 0; i <= minimum_phase->fft_size / 2; ++i)
      minimum_phase->log_spectrum[i] = log(spectrum[i]) / 2.0;
  GetMinimumPhaseSpectrum(minimum_phase);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      minimum_phase->minimum_phase_spectrum[i][0] *
      forward_real_fft->spectrum[i][0] -
      minimum_phase->minimum_phase_spectrum[i][1] *
      forward_real_fft->spectrum[i][1];
    inverse_real_fft->spectrum[i][1] =
      minimum_phase->minimum_phase_spectrum[i][0] *
      forward_real_fft->spectrum[i][1] +
      minimum_phase->minimum_phase_spectrum[i][1] *
      forward_real_fft->spectrum[i][0];
  }
  fft_execute(inverse_real_fft->inverse_fft);
  fftshift(inverse_real_fft->waveform, fft_size, aperiodic_response);
}